

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

bool __thiscall Lowerer::GenerateLdThisCheck(Lowerer *this,Instr *instr)

{
  RegOpnd *regOpnd;
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  undefined4 *puVar4;
  LabelInstr *labelHelper;
  LabelInstr *target;
  
  regOpnd = (RegOpnd *)instr->m_src1;
  OVar2 = IR::Opnd::GetKind((Opnd *)regOpnd);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  labelHelper = IR::LabelInstr::New(Label,this->m_func,true);
  target = IR::LabelInstr::New(Label,this->m_func,false);
  GenerateIsRecyclableObject(this,regOpnd,instr,labelHelper,true);
  if (instr->m_dst != (Opnd *)0x0) {
    bVar3 = IR::Opnd::IsEqual(instr->m_dst,(Opnd *)regOpnd);
    if (!bVar3) {
      InsertMove(instr->m_dst,(Opnd *)regOpnd,instr,true);
    }
  }
  InsertBranch(Br,false,target,instr);
  IR::Instr::InsertBefore(instr,&labelHelper->super_Instr);
  IR::Instr::InsertAfter(instr,&target->super_Instr);
  return true;
}

Assistant:

bool
Lowerer::GenerateLdThisCheck(IR::Instr * instr)
{
    //
    // If not a recyclable object, jump to $helper
    // MOV dst, src1                                      -- return the object itself
    // JMP $fallthrough
    // $helper:
    //      (caller generates helper call)
    // $fallthrough:
    //
    IR::RegOpnd * src1 = instr->GetSrc1()->AsRegOpnd();
    IR::LabelInstr * helper = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
    IR::LabelInstr * fallthrough = IR::LabelInstr::New(Js::OpCode::Label, m_func);

    GenerateIsRecyclableObject(src1, instr, helper);

    // MOV dst, src1
    if (instr->GetDst() && !instr->GetDst()->IsEqual(src1))
    {
        InsertMove(instr->GetDst(), src1, instr);
    }

    // JMP $fallthrough
    InsertBranch(Js::OpCode::Br, fallthrough, instr);

    // $helper:
    //      (caller generates helper call)
    // $fallthrough:
    instr->InsertBefore(helper);
    instr->InsertAfter(fallthrough);

    return true;
}